

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void NGA_Merge_distr_patch(int g_a,int *alo,int *ahi,int g_b,int *blo,int *bhi)

{
  int in_ECX;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  long in_R8;
  long in_R9;
  int i_3;
  int i_2;
  int i_1;
  int i;
  Integer _ga_bhi [7];
  Integer _ga_blo [7];
  Integer _ga_ahi [7];
  Integer _ga_alo [7];
  Integer bndim;
  Integer b;
  Integer andim;
  Integer a;
  int local_158;
  int local_154;
  int local_150;
  int local_14c;
  long local_148 [8];
  long local_108 [8];
  long local_c8 [8];
  long local_88 [7];
  Integer local_50;
  long local_48;
  Integer local_40;
  long local_38;
  long local_30;
  long local_28;
  int local_1c;
  long local_18;
  long local_10;
  
  local_38 = (long)in_EDI;
  local_30 = in_R9;
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_40 = pnga_ndim(_ga_ahi[2]);
  local_48 = (long)local_1c;
  local_50 = pnga_ndim(_ga_ahi[2]);
  for (local_14c = 0; local_14c < local_40; local_14c = local_14c + 1) {
    local_88[(local_40 - local_14c) + -1] = (long)*(int *)(local_10 + (long)local_14c * 4) + 1;
  }
  for (local_150 = 0; local_150 < local_40; local_150 = local_150 + 1) {
    local_c8[(local_40 - local_150) + -1] = (long)*(int *)(local_18 + (long)local_150 * 4) + 1;
  }
  for (local_154 = 0; local_154 < local_50; local_154 = local_154 + 1) {
    local_108[(local_50 - local_154) + -1] = (long)*(int *)(local_28 + (long)local_154 * 4) + 1;
  }
  for (local_158 = 0; local_158 < local_50; local_158 = local_158 + 1) {
    local_148[(local_50 - local_158) + -1] = (long)*(int *)(local_30 + (long)local_158 * 4) + 1;
  }
  pnga_merge_distr_patch
            (_ga_ahi[6],(Integer *)_ga_ahi[5],(Integer *)_ga_ahi[4],_ga_ahi[3],(Integer *)_ga_ahi[2]
             ,(Integer *)_ga_ahi[1]);
  return;
}

Assistant:

void NGA_Merge_distr_patch(int g_a, int *alo, int *ahi,
                          int g_b, int *blo, int *bhi)
{
    Integer a = (Integer)g_a;
    Integer andim = wnga_ndim(a);

    Integer b=(Integer)g_b;
    Integer bndim = wnga_ndim(b);
    Integer _ga_alo[MAXDIM], _ga_ahi[MAXDIM];
    Integer _ga_blo[MAXDIM], _ga_bhi[MAXDIM];
    
    COPYINDEX_C2F(alo,_ga_alo, andim);
    COPYINDEX_C2F(ahi,_ga_ahi, andim);
    
    COPYINDEX_C2F(blo,_ga_blo, bndim);
    COPYINDEX_C2F(bhi,_ga_bhi, bndim);

    wnga_merge_distr_patch(a, _ga_alo, _ga_ahi, b, _ga_blo, _ga_bhi);
}